

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall dg::vr::GraphBuilder::build(GraphBuilder *this)

{
  bool bVar1;
  ulong uVar2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  *in_RDI;
  Function *in_stack_00000008;
  Function *function;
  const_iterator __end2;
  const_iterator __begin2;
  Module *__range2;
  Function *in_stack_00000058;
  GraphBuilder *in_stack_00000060;
  Module *in_stack_ffffffffffffffc8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_18;
  node_pointer local_10;
  
  local_10 = in_RDI->NodePtr;
  local_18.NodePtr = (node_pointer)llvm::Module::begin(in_stack_ffffffffffffffc8);
  local_20.NodePtr = (node_pointer)llvm::Module::end(in_stack_ffffffffffffffc8);
  while (bVar1 = llvm::operator!=(&local_18,&local_20), bVar1) {
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                 *)0x1bc5c8);
    uVar2 = llvm::GlobalValue::isDeclaration();
    if ((uVar2 & 1) == 0) {
      buildBlocks((GraphBuilder *)function,in_stack_00000008);
      buildTerminators(in_stack_00000060,in_stack_00000058);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++(in_RDI);
  }
  return;
}

Assistant:

void GraphBuilder::build() {
    for (const llvm::Function &function : module) {
        if (function.isDeclaration())
            continue;

        buildBlocks(function);
        buildTerminators(function);
    }
}